

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_Solver.cpp
# Opt level: O1

void __thiscall BGCG_Solver::BGCG_Solver(BGCG_Solver *this,BGCG_constPtr *bg,size_t nrSolutions)

{
  int *piVar1;
  sp_counted_base *psVar2;
  sp_counted_base *psVar3;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_28;
  
  psVar2 = (bg->pn).pi_;
  local_28.px = &bg->px->super_BayesianGameIdenticalPayoffInterface;
  local_28.pn.pi_ = (bg->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  BayesianGameIdenticalPayoffSolver::BayesianGameIdenticalPayoffSolver
            (&this->super_BayesianGameIdenticalPayoffSolver,&local_28,nrSolutions);
  boost::detail::shared_count::~shared_count(&local_28.pn);
  (this->super_BayesianGameIdenticalPayoffSolver)._vptr_BayesianGameIdenticalPayoffSolver =
       (_func_int **)&PTR_InitDeadline_0059ea88;
  psVar2 = (bg->pn).pi_;
  psVar3 = (bg->pn).pi_;
  (this->_m_bgcg).px = bg->px;
  (this->_m_bgcg).pn.pi_ = psVar3;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return;
}

Assistant:

BGCG_Solver::BGCG_Solver(const BGCG_constPtr &bg, size_t nrSolutions):
    BayesianGameIdenticalPayoffSolver(bg, nrSolutions),
    _m_bgcg(bg)
{
}